

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ServerService.cpp
# Opt level: O0

void __thiscall
ServerService::retransmit
          (ServerService *this,byte4 seqNo,int socketFD,sockaddr_storage clientDetails,
          SendUnit *sendUnit)

{
  sockaddr_storage clientDetails_00;
  int socketFD_00;
  byte *buffer_00;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  unsigned_long uStack_30;
  byte *local_28;
  byte *buffer;
  SendUnit *sendUnit_local;
  int socketFD_local;
  byte4 seqNo_local;
  ServerService *this_local;
  
  buffer = (byte *)sendUnit;
  sendUnit_local._0_4_ = socketFD;
  sendUnit_local._4_4_ = seqNo;
  _socketFD_local = this;
  local_28 = (byte *)calloc(0x5c0,1);
  memset(local_28,0,0x5c0);
  buffer_00 = SendUnit::getSendUnit((SendUnit *)buffer,sendUnit_local._4_4_);
  socketFD_00 = (int)sendUnit_local;
  local_28 = buffer_00;
  memcpy(&local_a8,&clientDetails,0x80);
  clientDetails_00.__ss_padding[6] = (undefined1)uStack_a0;
  clientDetails_00.__ss_padding[7] = uStack_a0._1_1_;
  clientDetails_00.__ss_padding[8] = uStack_a0._2_1_;
  clientDetails_00.__ss_padding[9] = uStack_a0._3_1_;
  clientDetails_00.__ss_padding[10] = uStack_a0._4_1_;
  clientDetails_00.__ss_padding[0xb] = uStack_a0._5_1_;
  clientDetails_00.__ss_padding[0xc] = uStack_a0._6_1_;
  clientDetails_00.__ss_padding[0xd] = uStack_a0._7_1_;
  clientDetails_00.ss_family = (undefined2)local_a8;
  clientDetails_00.__ss_padding[0] = local_a8._2_1_;
  clientDetails_00.__ss_padding[1] = local_a8._3_1_;
  clientDetails_00.__ss_padding[2] = local_a8._4_1_;
  clientDetails_00.__ss_padding[3] = local_a8._5_1_;
  clientDetails_00.__ss_padding[4] = local_a8._6_1_;
  clientDetails_00.__ss_padding[5] = local_a8._7_1_;
  clientDetails_00.__ss_padding[0xe] = (undefined1)local_98;
  clientDetails_00.__ss_padding[0xf] = local_98._1_1_;
  clientDetails_00.__ss_padding[0x10] = local_98._2_1_;
  clientDetails_00.__ss_padding[0x11] = local_98._3_1_;
  clientDetails_00.__ss_padding[0x12] = local_98._4_1_;
  clientDetails_00.__ss_padding[0x13] = local_98._5_1_;
  clientDetails_00.__ss_padding[0x14] = local_98._6_1_;
  clientDetails_00.__ss_padding[0x15] = local_98._7_1_;
  clientDetails_00.__ss_padding[0x16] = (undefined1)uStack_90;
  clientDetails_00.__ss_padding[0x17] = uStack_90._1_1_;
  clientDetails_00.__ss_padding[0x18] = uStack_90._2_1_;
  clientDetails_00.__ss_padding[0x19] = uStack_90._3_1_;
  clientDetails_00.__ss_padding[0x1a] = uStack_90._4_1_;
  clientDetails_00.__ss_padding[0x1b] = uStack_90._5_1_;
  clientDetails_00.__ss_padding[0x1c] = uStack_90._6_1_;
  clientDetails_00.__ss_padding[0x1d] = uStack_90._7_1_;
  clientDetails_00.__ss_padding[0x1e] = (undefined1)local_88;
  clientDetails_00.__ss_padding[0x1f] = local_88._1_1_;
  clientDetails_00.__ss_padding[0x20] = local_88._2_1_;
  clientDetails_00.__ss_padding[0x21] = local_88._3_1_;
  clientDetails_00.__ss_padding[0x22] = local_88._4_1_;
  clientDetails_00.__ss_padding[0x23] = local_88._5_1_;
  clientDetails_00.__ss_padding[0x24] = local_88._6_1_;
  clientDetails_00.__ss_padding[0x25] = local_88._7_1_;
  clientDetails_00.__ss_padding[0x26] = (undefined1)uStack_80;
  clientDetails_00.__ss_padding[0x27] = uStack_80._1_1_;
  clientDetails_00.__ss_padding[0x28] = uStack_80._2_1_;
  clientDetails_00.__ss_padding[0x29] = uStack_80._3_1_;
  clientDetails_00.__ss_padding[0x2a] = uStack_80._4_1_;
  clientDetails_00.__ss_padding[0x2b] = uStack_80._5_1_;
  clientDetails_00.__ss_padding[0x2c] = uStack_80._6_1_;
  clientDetails_00.__ss_padding[0x2d] = uStack_80._7_1_;
  clientDetails_00.__ss_padding[0x2e] = (undefined1)local_78;
  clientDetails_00.__ss_padding[0x2f] = local_78._1_1_;
  clientDetails_00.__ss_padding[0x30] = local_78._2_1_;
  clientDetails_00.__ss_padding[0x31] = local_78._3_1_;
  clientDetails_00.__ss_padding[0x32] = local_78._4_1_;
  clientDetails_00.__ss_padding[0x33] = local_78._5_1_;
  clientDetails_00.__ss_padding[0x34] = local_78._6_1_;
  clientDetails_00.__ss_padding[0x35] = local_78._7_1_;
  clientDetails_00.__ss_padding[0x36] = (undefined1)uStack_70;
  clientDetails_00.__ss_padding[0x37] = uStack_70._1_1_;
  clientDetails_00.__ss_padding[0x38] = uStack_70._2_1_;
  clientDetails_00.__ss_padding[0x39] = uStack_70._3_1_;
  clientDetails_00.__ss_padding[0x3a] = uStack_70._4_1_;
  clientDetails_00.__ss_padding[0x3b] = uStack_70._5_1_;
  clientDetails_00.__ss_padding[0x3c] = uStack_70._6_1_;
  clientDetails_00.__ss_padding[0x3d] = uStack_70._7_1_;
  clientDetails_00.__ss_padding[0x3e] = (undefined1)local_68;
  clientDetails_00.__ss_padding[0x3f] = local_68._1_1_;
  clientDetails_00.__ss_padding[0x40] = local_68._2_1_;
  clientDetails_00.__ss_padding[0x41] = local_68._3_1_;
  clientDetails_00.__ss_padding[0x42] = local_68._4_1_;
  clientDetails_00.__ss_padding[0x43] = local_68._5_1_;
  clientDetails_00.__ss_padding[0x44] = local_68._6_1_;
  clientDetails_00.__ss_padding[0x45] = local_68._7_1_;
  clientDetails_00.__ss_padding[0x46] = (undefined1)uStack_60;
  clientDetails_00.__ss_padding[0x47] = uStack_60._1_1_;
  clientDetails_00.__ss_padding[0x48] = uStack_60._2_1_;
  clientDetails_00.__ss_padding[0x49] = uStack_60._3_1_;
  clientDetails_00.__ss_padding[0x4a] = uStack_60._4_1_;
  clientDetails_00.__ss_padding[0x4b] = uStack_60._5_1_;
  clientDetails_00.__ss_padding[0x4c] = uStack_60._6_1_;
  clientDetails_00.__ss_padding[0x4d] = uStack_60._7_1_;
  clientDetails_00.__ss_padding[0x4e] = (undefined1)local_58;
  clientDetails_00.__ss_padding[0x4f] = local_58._1_1_;
  clientDetails_00.__ss_padding[0x50] = local_58._2_1_;
  clientDetails_00.__ss_padding[0x51] = local_58._3_1_;
  clientDetails_00.__ss_padding[0x52] = local_58._4_1_;
  clientDetails_00.__ss_padding[0x53] = local_58._5_1_;
  clientDetails_00.__ss_padding[0x54] = local_58._6_1_;
  clientDetails_00.__ss_padding[0x55] = local_58._7_1_;
  clientDetails_00.__ss_padding[0x56] = (undefined1)uStack_50;
  clientDetails_00.__ss_padding[0x57] = uStack_50._1_1_;
  clientDetails_00.__ss_padding[0x58] = uStack_50._2_1_;
  clientDetails_00.__ss_padding[0x59] = uStack_50._3_1_;
  clientDetails_00.__ss_padding[0x5a] = uStack_50._4_1_;
  clientDetails_00.__ss_padding[0x5b] = uStack_50._5_1_;
  clientDetails_00.__ss_padding[0x5c] = uStack_50._6_1_;
  clientDetails_00.__ss_padding[0x5d] = uStack_50._7_1_;
  clientDetails_00.__ss_padding[0x5e] = (undefined1)local_48;
  clientDetails_00.__ss_padding[0x5f] = local_48._1_1_;
  clientDetails_00.__ss_padding[0x60] = local_48._2_1_;
  clientDetails_00.__ss_padding[0x61] = local_48._3_1_;
  clientDetails_00.__ss_padding[0x62] = local_48._4_1_;
  clientDetails_00.__ss_padding[99] = local_48._5_1_;
  clientDetails_00.__ss_padding[100] = local_48._6_1_;
  clientDetails_00.__ss_padding[0x65] = local_48._7_1_;
  clientDetails_00.__ss_padding[0x66] = (undefined1)uStack_40;
  clientDetails_00.__ss_padding[0x67] = uStack_40._1_1_;
  clientDetails_00.__ss_padding[0x68] = uStack_40._2_1_;
  clientDetails_00.__ss_padding[0x69] = uStack_40._3_1_;
  clientDetails_00.__ss_padding[0x6a] = uStack_40._4_1_;
  clientDetails_00.__ss_padding[0x6b] = uStack_40._5_1_;
  clientDetails_00.__ss_padding[0x6c] = uStack_40._6_1_;
  clientDetails_00.__ss_padding[0x6d] = uStack_40._7_1_;
  clientDetails_00.__ss_padding[0x6e] = (undefined1)local_38;
  clientDetails_00.__ss_padding[0x6f] = local_38._1_1_;
  clientDetails_00.__ss_padding[0x70] = local_38._2_1_;
  clientDetails_00.__ss_padding[0x71] = local_38._3_1_;
  clientDetails_00.__ss_padding[0x72] = local_38._4_1_;
  clientDetails_00.__ss_padding[0x73] = local_38._5_1_;
  clientDetails_00.__ss_padding[0x74] = local_38._6_1_;
  clientDetails_00.__ss_padding[0x75] = local_38._7_1_;
  clientDetails_00.__ss_align = uStack_30;
  sendResponse(this,socketFD_00,buffer_00,clientDetails_00);
  memset(local_28,0,0x5c0);
  free(local_28);
  return;
}

Assistant:

void ServerService::retransmit(byte4 seqNo, int socketFD, struct sockaddr_storage clientDetails, SendUnit *sendUnit) {
    byte *buffer = (byte *) calloc(MTU, sizeof(byte));
    memset(buffer, 0, MTU);
    buffer = sendUnit->getSendUnit(seqNo);
    sendResponse(socketFD, buffer, clientDetails);
    memset(buffer, 0, MTU);
    free(buffer);
}